

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 *cr_min,ImVec2 *cr_max,bool intersect_with_current_clip_rect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte in_CL;
  float *in_RDX;
  float *in_RSI;
  ImVec4 *in_RDI;
  float fVar5;
  float fVar6;
  ImVec4 current;
  ImVec4 cr;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  float fStack_38;
  float local_34;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  float fStack_28;
  float local_24;
  float fStack_20;
  
  ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffffd4,*in_RSI,in_RSI[1],*in_RDX,in_RDX[1]);
  if ((in_CL & 1) != 0) {
    uVar1 = in_RDI[8].z;
    uVar3 = in_RDI[8].w;
    uVar2 = in_RDI[9].x;
    uVar4 = in_RDI[9].y;
    if (in_stack_ffffffffffffffd4 < (float)uVar1) {
      in_stack_ffffffffffffffd4 = (float)uVar1;
    }
    if (fStack_28 < (float)uVar3) {
      fStack_28 = (float)uVar3;
    }
    if ((float)uVar2 < local_24) {
      local_24 = (float)uVar2;
    }
    in_stack_ffffffffffffffc4 = (float)uVar1;
    in_stack_ffffffffffffffd0 = (float)uVar4;
    if ((float)uVar4 < fStack_20) {
      fStack_20 = (float)uVar4;
    }
  }
  fVar5 = ImMax<float>(in_stack_ffffffffffffffd4,local_24);
  fVar6 = ImMax<float>(fStack_28,fStack_20);
  ImVector<ImVec4>::push_back
            ((ImVector<ImVec4> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_RDI);
  in_RDI[8].z = in_stack_ffffffffffffffd4;
  in_RDI[8].w = fStack_28;
  in_RDI[9].x = fVar5;
  in_RDI[9].y = fVar6;
  _OnChangedClipRect((ImDrawList *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

void ImDrawList::PushClipRect(const ImVec2& cr_min, const ImVec2& cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect)
    {
        ImVec4 current = _CmdHeader.ClipRect;
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    _CmdHeader.ClipRect = cr;
    _OnChangedClipRect();
}